

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O2

int yy_sequence(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = G->pos;
  iVar4 = G->thunkpos;
  iVar1 = yy_prefix(G);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
    while( true ) {
      iVar3 = G->pos;
      iVar4 = G->thunkpos;
      iVar2 = yy_prefix(G);
      if (iVar2 == 0) break;
      yyDo(G,yy_1_sequence,G->begin,G->end,"yy_1_sequence");
    }
  }
  G->pos = iVar3;
  G->thunkpos = iVar4;
  return iVar1;
}

Assistant:

YY_RULE(int) yy_sequence(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "sequence"));
  if (!yy_prefix(G))  goto l87;

  l88:;	
  {  int yypos89= G->pos, yythunkpos89= G->thunkpos;  if (!yy_prefix(G))  goto l89;
  yyDo(G, yy_1_sequence, G->begin, G->end, "yy_1_sequence");
  goto l88;
  l89:;	  G->pos= yypos89; G->thunkpos= yythunkpos89;
  }  yyprintf((stderr, "  ok   sequence"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l87:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "sequence"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}